

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FixExpr(DbFixer *pFix,Expr *pExpr)

{
  Select *pSelect;
  int iVar1;
  int iVar2;
  SrcList **ppSVar3;
  
  if (pExpr != (Expr *)0x0) {
    do {
      if (pExpr->op == 0x90) {
        if ((pFix->pParse->db->init).busy == '\0') {
          sqlite3ErrorMsg(pFix->pParse,"%s cannot use variables",pFix->zType);
          return 1;
        }
        pExpr->op = 'n';
      }
      if ((pExpr->flags & 0x804000) != 0) {
        return 0;
      }
      pSelect = (Select *)(pExpr->x).pList;
      if ((pExpr->flags >> 0xb & 1) == 0) {
        if ((pSelect != (Select *)0x0) && (0 < *(int *)&pSelect->pEList)) {
          ppSVar3 = (SrcList **)&pSelect->op;
          iVar2 = 0;
          do {
            iVar1 = sqlite3FixExpr(pFix,(Expr *)*ppSVar3);
            if (iVar1 != 0) {
              return 1;
            }
            iVar2 = iVar2 + 1;
            ppSVar3 = ppSVar3 + 4;
          } while (iVar2 < *(int *)&pSelect->pEList);
        }
      }
      else {
        iVar2 = sqlite3FixSelect(pFix,pSelect);
        if (iVar2 != 0) {
          return 1;
        }
      }
      iVar2 = sqlite3FixExpr(pFix,pExpr->pRight);
      if (iVar2 != 0) {
        return 1;
      }
      pExpr = pExpr->pLeft;
    } while (pExpr != (Expr *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixExpr(
  DbFixer *pFix,     /* Context of the fixation */
  Expr *pExpr        /* The expression to be fixed to one database */
){
  while( pExpr ){
    if( pExpr->op==TK_VARIABLE ){
      if( pFix->pParse->db->init.busy ){
        pExpr->op = TK_NULL;
      }else{
        sqlite3ErrorMsg(pFix->pParse, "%s cannot use variables", pFix->zType);
        return 1;
      }
    }
    if( ExprHasProperty(pExpr, EP_TokenOnly|EP_Leaf) ) break;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      if( sqlite3FixSelect(pFix, pExpr->x.pSelect) ) return 1;
    }else{
      if( sqlite3FixExprList(pFix, pExpr->x.pList) ) return 1;
    }
    if( sqlite3FixExpr(pFix, pExpr->pRight) ){
      return 1;
    }
    pExpr = pExpr->pLeft;
  }
  return 0;
}